

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoutils.c
# Opt level: O2

int nsdiffs(double *x,int N,int f,double *alpha,char *test,int *max_D)

{
  int iVar1;
  double *sig;
  double *oup;
  char *__s;
  uint uVar2;
  size_t __size;
  uint local_3c;
  double local_38;
  
  if (alpha == (double *)0x0) {
    local_38 = 0.05;
  }
  else {
    local_38 = *alpha;
  }
  if (max_D == (int *)0x0) {
    local_3c = 1;
  }
  else {
    local_3c = *max_D;
    if ((int)local_3c < 0) {
      puts("Error. Maximum Difference cannot be less than 0 ");
      exit(-1);
    }
  }
  if (0.01 <= local_38) {
    if (local_38 <= 0.1) goto LAB_001306ed;
    local_38 = 0.1;
    __s = "Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.1. ";
  }
  else {
    local_38 = 0.01;
    __s = "Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.01. ";
  }
  puts(__s);
LAB_001306ed:
  iVar1 = strcmp(test,"ocsb");
  if (((local_38 != 0.05) || (NAN(local_38))) && (iVar1 == 0)) {
    printf(
          "Significance levels other than 5%% are not currently supported by test=\'ocsb\', defaulting to alpha = 0.05."
          );
  }
  iVar1 = checkConstant(x,N);
  uVar2 = 0;
  if (iVar1 != 1) {
    if (f < 2) {
      puts("Warning : Only data with f > 1 can be differenced. ");
      uVar2 = 0;
    }
    else {
      iVar1 = runseasonalitytests(x,N,f,test);
      __size = (long)N << 3;
      sig = (double *)malloc(__size);
      oup = (double *)malloc(__size);
      memcpy(sig,x,__size);
      uVar2 = 0;
      while( true ) {
        if ((iVar1 != 1) || (local_3c <= uVar2)) goto LAB_00130801;
        N = diffs(sig,N,1,f,oup);
        iVar1 = checkConstant(oup,N);
        if (iVar1 == 1) break;
        iVar1 = runseasonalitytests(oup,N,f,test);
        memcpy(sig,oup,(long)N << 3);
        uVar2 = uVar2 + 1;
      }
      uVar2 = uVar2 + 1;
LAB_00130801:
      free(sig);
      free(oup);
    }
  }
  return uVar2;
}

Assistant:

int nsdiffs(double *x, int N,int f,double *alpha, const char *test, int *max_D)  {
    int D,max_D_,cc,NX,dodiff;
    double alpha_;
    double *y,*z;

    D = 0;

    alpha_ = alpha == NULL ? 0.05 : *alpha;
    max_D_ = max_D == NULL ? 1 : *max_D;

    if (max_D_ < 0) {
        printf("Error. Maximum Difference cannot be less than 0 \n");
        exit(-1);
    } 

    if (alpha_ < 0.01) {
        alpha_ = 0.01;
        printf("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.01. \n");
    }

    if (alpha_ > 0.1) {
        alpha_ = 0.1;
        printf("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.1. \n");
    }

    if (!strcmp(test,"ocsb")) {
        if (alpha_ != 0.05) {
            printf("Significance levels other than 5%% are not currently supported by test='ocsb', defaulting to alpha = 0.05.");
            alpha_ = 0.05;
        }
    }

    cc = checkConstant(x,N);
    //printf("cc %d \n",cc);

    if (cc == 1) return D;

    NX = N;

    if (f <= 1) {
        printf("Warning : Only data with f > 1 can be differenced. \n");
        return 0;
    }

    dodiff = runseasonalitytests(x,N,f,test);

    y = (double*)malloc(sizeof(double)*NX);
    z = (double*)malloc(sizeof(double)*NX);

    memcpy(y,x,sizeof(double)*NX);

    while (dodiff == 1 && D < max_D_) {
        D++;
        NX = diffs(y,NX,1,f,z);

        cc = checkConstant(z,NX);

        //printf("cc %d \n",cc);

        if (cc == 1) break;

        dodiff = runseasonalitytests(z,NX,f,test);
        memcpy(y,z,sizeof(double)*NX);
    }

    free(y);
    free(z);

    return D;
}